

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O0

int http_request(http_reply *http,char *host_name,char *port_str,char *http_string,size_t rlen)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  char *pcVar4;
  ulong uVar5;
  char *local_da0;
  char *ptr;
  char *ch;
  timeval tv;
  char *mime_type;
  phr_chunked_decoder http_decoder;
  phr_header headers [100];
  size_t body_size;
  size_t header_size;
  size_t headers_num;
  size_t msg_size;
  char *http_msg;
  int http_minor;
  int http_chunked;
  int bytes;
  int used;
  char *buf;
  int local_80;
  int i;
  int sd;
  int rc;
  addrinfo *resolve_array;
  addrinfo *res;
  addrinfo hints;
  size_t rlen_local;
  char *http_string_local;
  char *port_str_local;
  char *host_name_local;
  http_reply *http_local;
  
  hints.ai_next = (addrinfo *)rlen;
  memset(&mime_type,0,0x10);
  ch = (char *)(long)timeout;
  tv.tv_sec = 0;
  if (v_flag != 0) {
    fprintf(_stdout,"%s: connecting to %s:%s\n",pname,host_name,port_str);
  }
  memset(&res,0,0x30);
  res._4_4_ = 0;
  hints.ai_flags = 1;
  hints.ai_family = 0;
  res._0_4_ = 0x28;
  i = getaddrinfo(host_name,port_str,(addrinfo *)&res,(addrinfo **)&sd);
  if (i == 0) {
    i = 0;
    resolve_array = (addrinfo *)_sd;
    while (resolve_array != (addrinfo *)0x0) {
      local_80 = socket(resolve_array->ai_family,resolve_array->ai_socktype,
                        resolve_array->ai_protocol);
      if (-1 < local_80) {
        i = connect(local_80,(sockaddr *)resolve_array->ai_addr,resolve_array->ai_addrlen);
        if (-1 < i) break;
        close(local_80);
      }
      resolve_array = (addrinfo *)_sd->ai_next;
    }
    freeaddrinfo(_sd);
    if (resolve_array == (addrinfo *)0x0) {
      perror("cannot connect");
      http_local._4_4_ = 1;
    }
    else {
      setsockopt(local_80,1,0x14,&ch,0x10);
      setsockopt(local_80,1,0x15,&ch,0x10);
      sVar3 = send(local_80,http_string,(size_t)hints.ai_next,0);
      i = (int)sVar3;
      if (i < 0) {
        perror("cannot send data ");
        close(local_80);
        http_local._4_4_ = 1;
      }
      else if ((addrinfo *)(long)i == hints.ai_next) {
        _bytes = (char *)malloc(0x400);
        http_chunked = 0;
        while( true ) {
          sVar3 = recv(local_80,_bytes + http_chunked,0x400,0);
          http_minor = (int)sVar3;
          if (http_minor < 1) break;
          http_chunked = http_minor + http_chunked;
          _bytes = (char *)realloc(_bytes,(long)(http_chunked + 0x400));
        }
        if (http_minor < 0) {
          perror("error receiving data ");
          close(local_80);
          http_local._4_4_ = 1;
        }
        else {
          header_size = 100;
          iVar1 = phr_parse_response(_bytes,(long)http_chunked,(int *)&http_msg,&http->status,
                                     (char **)&msg_size,&headers_num,
                                     (phr_header *)&http_decoder.consume_trailer,&header_size,0);
          i = iVar1;
          if (iVar1 < 0) {
            fprintf(_stderr,"cannot parse response\n");
            close(local_80);
            http_local._4_4_ = 2;
          }
          else {
            tv.tv_usec = 0;
            http_msg._4_4_ = 0;
            for (buf._4_4_ = 0; (ulong)(long)buf._4_4_ < header_size; buf._4_4_ = buf._4_4_ + 1) {
              for (ptr = (char *)headers[(long)buf._4_4_ + -1].value_len;
                  ptr < headers[buf._4_4_].name + headers[(long)buf._4_4_ + -1].value_len;
                  ptr = ptr + 1) {
                iVar2 = tolower((int)*ptr);
                *ptr = (char)iVar2;
              }
              iVar2 = strncmp("content-type",(char *)headers[(long)buf._4_4_ + -1].value_len,
                              (size_t)headers[buf._4_4_].name);
              if (iVar2 == 0) {
                tv.tv_usec = headers[buf._4_4_].name_len;
                *(char *)(tv.tv_usec + (long)headers[buf._4_4_].value) = '\0';
                pcVar4 = strchr((char *)tv.tv_usec,0x3b);
                if (pcVar4 != (char *)0x0) {
                  *pcVar4 = '\0';
                }
              }
              else {
                iVar2 = strncmp("transfer-encoding",(char *)headers[(long)buf._4_4_ + -1].value_len,
                                (size_t)headers[buf._4_4_].name);
                if ((iVar2 == 0) &&
                   (iVar2 = strncmp("chunked",(char *)headers[buf._4_4_].name_len,
                                    (size_t)headers[buf._4_4_].value), iVar2 == 0)) {
                  http_msg._4_4_ = 1;
                }
              }
            }
            if (v_flag != 0) {
              if (tv.tv_usec == 0) {
                local_da0 = "missing";
              }
              else {
                local_da0 = (char *)tv.tv_usec;
              }
              fprintf(_stdout,"%s: server response status code: %d, MIME header: %s\n",pname,
                      (ulong)(uint)http->status,local_da0);
            }
            http->mime_type = (char *)tv.tv_usec;
            http->payload = _bytes + iVar1;
            headers[99].value_len = (long)http_chunked - (long)iVar1;
            if (http_msg._4_4_ != 0) {
              uVar5 = phr_decode_chunked((phr_chunked_decoder *)&mime_type,http->payload,
                                         &headers[99].value_len);
              i = (int)uVar5;
              if (i < 0) {
                fprintf(_stderr,"%i cannot decode chunked payload\n",uVar5 & 0xffffffff);
                close(local_80);
                return 2;
              }
            }
            http->payload[headers[99].value_len] = '\0';
            http->bytes = (int)headers[99].value_len;
            close(local_80);
            http_local._4_4_ = 0;
          }
        }
      }
      else {
        fprintf(_stderr,"incomplete send\n");
        close(local_80);
        http_local._4_4_ = 1;
      }
    }
  }
  else {
    fprintf(_stderr,"failed to resolve remote host address %s (err=%d)\n",host_name,(ulong)(uint)i);
    http_local._4_4_ = 1;
  }
  return http_local._4_4_;
}

Assistant:

int http_request(struct http_reply *http, const char* host_name, const char *port_str,
                   const char *http_string, size_t rlen)
{
	struct addrinfo hints;
	struct addrinfo *res, *resolve_array;
	int rc, sd, i;

	char *buf;
	int used, bytes, http_chunked;
	int http_minor;
	const char *http_msg;
	size_t msg_size, headers_num, header_size, body_size;
	struct phr_header headers[100];
	struct phr_chunked_decoder http_decoder = {0};
	char *mime_type;
#ifdef WIN32
	int tv=timeout*1000;
#else
	struct timeval tv;
	tv.tv_sec = timeout;
	tv.tv_usec = 0;
#endif

	if (v_flag)
		fprintf(stdout, "%s: connecting to %s:%s\n", pname, host_name, port_str);

	/* resolve name */
	memset(&hints, 0, sizeof(hints));
	hints.ai_family = AF_UNSPEC;
	hints.ai_socktype = SOCK_STREAM;
	hints.ai_protocol = 0;
	hints.ai_flags = (AI_ADDRCONFIG | AI_V4MAPPED);
	rc = getaddrinfo(host_name, port_str, &hints, &resolve_array);
	if (rc!=0) {
		fprintf(stderr, "failed to resolve remote host address %s (err=%d)\n", host_name, rc);
		return (1);
	}

	/* getaddrinfo() returns a list of address structures.
		Try each address until we successfully connect.
		If socket (or connect) fails, we close the socket
		and try the next address. */
	for (res = resolve_array;
		res != NULL;
		res = resolve_array->ai_next) {
		sd = socket(res->ai_family, res->ai_socktype, res->ai_protocol);
		if (sd < 0) {
			continue;
		}

		/* connect to server */
		/* The two socket options SO_RCVTIMEO and SO_SNDTIMEO do not work with connect
		connect has a default timeout of 120 */
		rc = connect(sd, res->ai_addr, res->ai_addrlen);
		if (rc < 0) {
			close(sd);
			continue;
		}

		/* connected, exit loop */
		break;
	}

	freeaddrinfo(resolve_array);
	if (!res ) {
		perror("cannot connect");
		return (1);
	}

	setsockopt(sd,SOL_SOCKET, SO_RCVTIMEO,(void *)&tv, sizeof(tv));
	setsockopt(sd,SOL_SOCKET, SO_SNDTIMEO,(void *)&tv, sizeof(tv));

	/* send data */
	rc = send(sd, http_string, rlen, 0);

	if (rc < 0) {
		perror("cannot send data ");
		close(sd);
		return (1);
	}
	else if(rc != rlen)
	{
		fprintf(stderr,"incomplete send\n");
		close(sd);
		return (1);
	}

	/* Get response */
	buf = (char *)malloc(1024);
        used = 0;
        while ((bytes = recv(sd,&buf[used],1024,0)) > 0) {
                used += bytes;
                buf = (char *)realloc(buf, used + 1024);
	}
	if (bytes < 0) {
		perror("error receiving data ");
		close(sd);
		return (1);
	}

	headers_num = sizeof(headers) / sizeof(headers[0]);
	rc = phr_parse_response(buf, used, &http_minor, &http->status,
			&http_msg, &msg_size, headers, &headers_num, 0);
	if (rc < 0) {
		fprintf(stderr,"cannot parse response\n");
		close(sd);
		return (2);
	}
	header_size = rc;

	mime_type = NULL;
	http_chunked = 0;
	for (i = 0; i < headers_num; i++)
	{
		char *ch;
		/* convert to lowercase as some platforms don't have strcasecmp */
		for (ch = (char *)headers[i].name; ch < headers[i].name+headers[i].name_len; ch++)
			*ch = tolower(*ch);

		if (!strncmp("content-type", headers[i].name, headers[i].name_len))
		{
			char *ptr;

			mime_type = (char *)headers[i].value;
			mime_type[headers[i].value_len] = '\0';

			if ((ptr = strchr(mime_type, ';')))
				*ptr = '\0';
		}
		else if (!strncmp("transfer-encoding", headers[i].name, headers[i].name_len) &&
			!strncmp("chunked", headers[i].value, headers[i].value_len))
		{
			http_chunked = 1;
		}
	}

	if (v_flag)
		fprintf(stdout, "%s: server response status code: %d, MIME header: %s\n",
			pname, http->status, mime_type ? mime_type : "missing");

	http->mime_type = mime_type;
	http->payload = buf+header_size;
	body_size = used-header_size;

	if (http_chunked)
	{
		rc = phr_decode_chunked(&http_decoder, http->payload, &body_size);
		if (rc < 0) {
			fprintf(stderr,"%i cannot decode chunked payload\n", rc);
			close(sd);
			return (2);
		}
	}

	http->payload[body_size] = '\0';
	http->bytes = body_size;

#ifdef WIN32
	closesocket(sd);
#else
	close(sd);
#endif
	return (0);
}